

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

int32_t __thiscall
aeron::archive::AeronArchive::findLastMatchingRecording
          (AeronArchive *this,int64_t minRecordingId,string *channelFragment,int32_t streamId,
          int32_t sessionId)

{
  int64_t iVar1;
  int32_t local_60;
  int32_t local_5c;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  int64_t local_38;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_60 = sessionId;
  local_5c = streamId;
  local_38 = minRecordingId;
  local_58._M_unused._M_object = operator_new(0x28);
  *(AeronArchive **)local_58._M_unused._0_8_ = this;
  *(int64_t **)((long)local_58._M_unused._0_8_ + 8) = &local_38;
  *(string **)((long)local_58._M_unused._0_8_ + 0x10) = channelFragment;
  *(int32_t **)((long)local_58._M_unused._0_8_ + 0x18) = &local_5c;
  *(int32_t **)((long)local_58._M_unused._0_8_ + 0x20) = &local_60;
  pcStack_40 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:301:9)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:301:9)>
             ::_M_manager;
  iVar1 = callAndPollForResponse
                    (this,(function<bool_(long)> *)&local_58,"find last matching recording");
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::findLastMatchingRecording(std::int64_t minRecordingId, const std::string& channelFragment,
                                                     std::int32_t streamId, std::int32_t sessionId) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->findLastMatchingRecording(minRecordingId, channelFragment, streamId, sessionId,
                                                                  correlationId, controlSessionId_);
        },
        "find last matching recording");
}